

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmsnorm_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::RMSNorm_x86_avx::forward_inplace(RMSNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  long *in_RSI;
  long in_RDI;
  float *ptr_3;
  int q_1;
  float *ptr_2;
  int i_1;
  int q;
  float *ptr_1;
  int i;
  float *ptr;
  int elempack;
  int channels;
  int h;
  int w;
  int dims;
  Mat *m_1;
  Mat *m;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined4 local_2b8;
  long local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined8 local_290;
  long local_288;
  int local_280;
  undefined8 local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined4 local_258;
  long local_250;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined8 local_230;
  long local_228;
  int local_220;
  int local_21c;
  long local_218;
  int local_20c;
  long local_208;
  undefined4 local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  long *local_1e0;
  undefined8 *local_1d0;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  int local_19c;
  undefined8 *local_198;
  int local_18c;
  long *local_188;
  undefined1 local_17d;
  int local_17c;
  undefined8 *local_170;
  undefined1 local_165;
  int local_164;
  undefined8 *local_158;
  undefined8 *local_140;
  undefined8 *local_130;
  long local_120;
  undefined4 local_114;
  long local_110;
  long local_108;
  undefined4 local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  long local_e8;
  undefined4 local_dc;
  long local_d8;
  long local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined8 *local_78;
  int in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  float *in_stack_ffffffffffffffb8;
  
  local_1ec = (int)in_RSI[5];
  local_1f0 = *(int *)((long)in_RSI + 0x2c);
  local_1f4 = (int)in_RSI[6];
  local_1f8 = (int)in_RSI[7];
  local_1fc = (undefined4)in_RSI[3];
  local_1e0 = in_RSI;
  if (local_1ec == 1) {
    local_208 = *in_RSI;
    local_1a8 = in_RDI + 0xe0;
    rmsnorm(in_stack_ffffffffffffffb8,
            (float *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
            (float)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
            in_stack_ffffffffffffffa4);
  }
  if (local_1ec == 2) {
    for (local_20c = 0; local_20c < local_1f4; local_20c = local_20c + 1) {
      local_188 = local_1e0;
      local_18c = local_20c;
      local_218 = *local_1e0 +
                  (long)*(int *)((long)local_1e0 + 0x2c) * (long)local_20c * local_1e0[2];
      local_1b0 = in_RDI + 0xe0;
      rmsnorm(in_stack_ffffffffffffffb8,
              (float *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
              (float)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
              in_stack_ffffffffffffffa4);
    }
  }
  if (local_1ec == 3) {
    if (*(int *)(in_RDI + 0xd0) == local_1f0) {
      for (local_21c = 0; local_21c < local_1f8; local_21c = local_21c + 1) {
        for (local_220 = 0; local_220 < local_1f4; local_220 = local_220 + 1) {
          local_158 = &local_270;
          local_f4 = *(int *)((long)local_1e0 + 0x2c);
          local_f8 = (int)local_1e0[6];
          local_fc = *(undefined4 *)((long)local_1e0 + 0x34);
          local_108 = *local_1e0 + local_1e0[8] * (long)local_21c * local_1e0[2];
          local_110 = local_1e0[2];
          local_114 = (undefined4)local_1e0[3];
          local_120 = local_1e0[4];
          local_f0 = &local_270;
          local_98 = (long)local_f4 * (long)local_f8 * local_110;
          local_198 = &local_270;
          local_228 = local_108 + (long)local_f4 * (long)local_220 * local_110;
          local_140 = &local_270;
          local_9c = 0x10;
          local_164 = local_21c;
          local_165 = 1;
          local_19c = local_220;
          local_270 = 0;
          local_260 = 0;
          local_258 = 0;
          local_248 = 0;
          local_244 = 0;
          local_240 = 0;
          local_23c = 0;
          local_238 = 0;
          local_230 = 0;
          local_268 = 0;
          local_1b8 = in_RDI + 0xe0;
          local_250 = local_120;
          rmsnorm(in_stack_ffffffffffffffb8,
                  (float *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                  (float)((ulong)local_140 >> 0x20),(int)local_140,in_stack_ffffffffffffffa4);
        }
      }
    }
    else {
      for (local_280 = 0; local_280 < local_1f8; local_280 = local_280 + 1) {
        local_170 = &local_2d0;
        local_bc = *(int *)((long)local_1e0 + 0x2c);
        local_c0 = (int)local_1e0[6];
        local_c4 = *(undefined4 *)((long)local_1e0 + 0x34);
        local_288 = *local_1e0 + local_1e0[8] * (long)local_280 * local_1e0[2];
        local_d8 = local_1e0[2];
        local_dc = (undefined4)local_1e0[3];
        local_e8 = local_1e0[4];
        local_b8 = &local_2d0;
        local_a8 = (long)local_bc * (long)local_c0 * local_d8;
        local_1d0 = &local_2d0;
        local_130 = &local_2d0;
        local_ac = 0x10;
        local_17c = local_280;
        local_17d = 1;
        local_2d0 = 0;
        local_2c0 = 0;
        local_2b8 = 0;
        local_2a8 = 0;
        local_2a4 = 0;
        local_2a0 = 0;
        local_29c = 0;
        local_298 = 0;
        local_290 = 0;
        local_2c8 = 0;
        local_1c0 = in_RDI + 0xe0;
        local_d0 = local_288;
        local_78 = local_130;
        local_2b0 = local_e8;
        rmsnorm(in_stack_ffffffffffffffb8,
                (float *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                (float)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8,
                in_stack_ffffffffffffffa4);
      }
    }
  }
  return 0;
}

Assistant:

int RMSNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int w = bottom_top_blob.w;
    const int h = bottom_top_blob.h;
    const int channels = bottom_top_blob.c;
    const int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        // assert affine_size == w

        float* ptr = bottom_top_blob;
        rmsnorm(ptr, gamma_data, eps, w * elempack, 1);
    }

    if (dims == 2)
    {
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            rmsnorm(ptr, gamma_data, eps, w, elempack);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    rmsnorm(ptr, gamma_data, eps, w, elempack);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                rmsnorm(ptr, gamma_data, eps, w * h, elempack);
            }
        }
    }

    return 0;
}